

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

int Rtm_ManMarkAutoBwd(Rtm_Man_t *pRtm)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  
  if (pRtm->vObjs->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  puVar1 = (uint *)((long)*pRtm->vObjs->pArray + 8);
  *puVar1 = *puVar1 | 0x10;
  pVVar4 = pRtm->vPis;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)pVVar4->pArray[lVar3] + 8);
      *puVar1 = *puVar1 | 0x10;
      lVar3 = lVar3 + 1;
      pVVar4 = pRtm->vPis;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = pRtm->vPos;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      Rtm_ObjMarkAutoBwd_rec((Rtm_Obj_t *)pVVar4->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar4 = pRtm->vPos;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = pRtm->vObjs;
  if (pVVar4->nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      uVar5 = *(uint *)((long)pVVar4->pArray[lVar3] + 8) ^ 0x10;
      *(uint *)((long)pVVar4->pArray[lVar3] + 8) = uVar5;
      iVar2 = iVar2 + (uint)((uVar5 >> 4 & 1) != 0);
      lVar3 = lVar3 + 1;
      pVVar4 = pRtm->vObjs;
    } while (lVar3 < pVVar4->nSize);
  }
  return iVar2;
}

Assistant:

int Rtm_ManMarkAutoBwd( Rtm_Man_t * pRtm )
{
    Rtm_Obj_t * pObjRtm;
    int i, Counter = 0;
    // mark nodes reachable from the PIs
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->fAuto = 1;
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->fAuto = 1;
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Rtm_ObjMarkAutoBwd_rec( pObjRtm );
    // count the number of autonomous nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    {
        pObjRtm->fAuto = !pObjRtm->fAuto;
        Counter += pObjRtm->fAuto;
    }
    // mark the fanins of the autonomous nodes
    return Counter;
}